

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O2

void __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::Buffer::BindBase(Buffer *this,GLuint index)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  BindBase((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,this->m_target,index);
  return;
}

Assistant:

void Buffer::BindBase(glw::GLuint index) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	BindBase(gl, m_id, m_target, index);
}